

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O3

void pzshape::TPZShapePiram::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  lVar16 = 5;
  do {
    iVar9 = pztopology::TPZPyramid::ContainedSideLocId((int)lVar16,0);
    iVar10 = pztopology::TPZPyramid::ContainedSideLocId((int)lVar16,1);
    lVar13 = (long)iVar9;
    if (((iVar9 < 0) ||
        (lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar12 <= lVar13)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2 = phi->fElem;
    lVar15 = (long)iVar10;
    if ((iVar10 < 0) || (lVar12 <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar12 <= lVar16) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2[lVar16] = pdVar2[lVar13] * pdVar2[lVar15];
    lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if (((lVar12 < 1) || (iVar9 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar10 < 0) ||
        (lVar14 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar14 <= lVar15)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar9 < 0) || (lVar14 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar14 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar14 < 1) ||
       (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
       iVar10 < 0 || lVar3 <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2 = dphi->fElem;
    if ((lVar14 < 1) || (lVar3 <= lVar16)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2[lVar14 * lVar16] =
         dphi->fElem[lVar12 * lVar13] * phi->fElem[lVar15] +
         phi->fElem[lVar13] * pdVar2[lVar14 * lVar15];
    if (((lVar14 < 2) || (iVar9 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar10 < 0) ||
        (lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar12 <= lVar15)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar9 < 0) || (lVar12 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar12 < 2) ||
       (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
       iVar10 < 0 || lVar3 <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar4 = dphi->fElem;
    if ((lVar12 < 2) || (lVar3 <= lVar16)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar4[lVar12 * lVar16 + 1] =
         pdVar2[lVar14 * lVar13 + 1] * phi->fElem[lVar15] +
         phi->fElem[lVar13] * pdVar4[lVar12 * lVar15 + 1];
    if (((lVar12 < 3) || (iVar9 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar10 < 0) ||
        (lVar14 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar14 <= lVar15)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar9 < 0) || (lVar14 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar14 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar14 < 3) ||
       (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
       iVar10 < 0 || lVar3 <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar14 < 3) || (lVar3 <= lVar16)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dphi->fElem[lVar14 * lVar16 + 2] =
         pdVar4[lVar12 * lVar13 + 2] * phi->fElem[lVar15] +
         phi->fElem[lVar13] * dphi->fElem[lVar15 * lVar14 + 2];
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0xd);
  lVar16 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar16 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = phi->fElem;
  if (lVar16 < 3) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (lVar16 < 0xe) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2[0xd] = *pdVar2 * pdVar2[2];
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar16 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar13 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar13 < 3 || lVar16 < 1) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = dphi->fElem;
  if ((lVar16 < 1) || (lVar13 < 0xe)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2[lVar16 * 0xd] = *dphi->fElem * phi->fElem[2] + *phi->fElem * pdVar2[lVar16 * 2];
  if ((lVar16 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar16 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar13 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar13 < 3 || lVar16 < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar4 = dphi->fElem;
  if ((lVar16 < 2) || (lVar13 < 0xe)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar4[lVar16 * 0xd + 1] = pdVar2[1] * phi->fElem[2] + *phi->fElem * pdVar4[lVar16 * 2 + 1];
  if ((lVar16 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar16 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar13 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar13 < 3 || lVar16 < 3) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar16 < 3) || (lVar13 < 0xe)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dphi->fElem[lVar16 * 0xd + 2] =
       pdVar4[2] * phi->fElem[2] + *phi->fElem * dphi->fElem[lVar16 * 2 + 2];
  lVar16 = 0xe;
  while( true ) {
    iVar11 = (int)lVar16;
    iVar9 = pztopology::TPZPyramid::ContainedSideLocId(iVar11,0);
    iVar10 = pztopology::TPZPyramid::ContainedSideLocId(iVar11,1);
    iVar11 = pztopology::TPZPyramid::ContainedSideLocId(iVar11,2);
    lVar13 = (long)iVar9;
    if (((iVar9 < 0) ||
        (lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar12 <= lVar13)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2 = phi->fElem;
    lVar15 = (long)iVar10;
    if ((iVar10 < 0) || (lVar12 <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar14 = (long)iVar11;
    if ((iVar11 < 0) || (lVar12 <= lVar14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (lVar12 <= lVar16) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2[lVar16] = pdVar2[lVar13] * pdVar2[lVar15] * pdVar2[lVar14];
    lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if (((lVar12 < 1) || (iVar9 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar10 < 0) ||
        (lVar3 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar3 <= lVar15)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2 = phi->fElem;
    if ((iVar11 < 0) || (lVar3 <= lVar14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar9 < 0) || (lVar3 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if (((lVar3 < 1) || (iVar10 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar11 < 0) ||
        (lVar5 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar5 <= lVar14)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar4 = phi->fElem;
    if ((iVar9 < 0) || (lVar5 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar10 < 0) || (lVar5 <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar5 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar5 < 1) ||
       (lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
       iVar11 < 0 || lVar6 <= lVar14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar7 = dphi->fElem;
    if ((lVar5 < 1) || (lVar6 <= lVar16)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar7[lVar5 * lVar16] =
         pdVar4[lVar13] * pdVar4[lVar15] * pdVar7[lVar5 * lVar14] +
         dphi->fElem[lVar12 * lVar13] * pdVar2[lVar15] * pdVar2[lVar14] +
         pdVar2[lVar13] * dphi->fElem[lVar3 * lVar15] * pdVar4[lVar14];
    if (((lVar5 < 2) || (iVar9 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar10 < 0) ||
        (lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar12 <= lVar15)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2 = phi->fElem;
    if ((iVar11 < 0) || (lVar12 <= lVar14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar9 < 0) || (lVar12 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if (((lVar12 < 2) || (iVar10 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar11 < 0) ||
        (lVar3 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar3 <= lVar14)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar4 = phi->fElem;
    if ((iVar9 < 0) || (lVar3 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar10 < 0) || (lVar3 <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar3 < 2) ||
       (lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
       iVar11 < 0 || lVar6 <= lVar14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar8 = dphi->fElem;
    if ((lVar3 < 2) || (lVar6 <= lVar16)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar8[lVar3 * lVar16 + 1] =
         pdVar4[lVar13] * pdVar4[lVar15] * pdVar8[lVar3 * lVar14 + 1] +
         pdVar7[lVar5 * lVar13 + 1] * pdVar2[lVar15] * pdVar2[lVar14] +
         pdVar2[lVar13] * dphi->fElem[lVar12 * lVar15 + 1] * pdVar4[lVar14];
    if (((lVar3 < 3) || (iVar9 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar10 < 0) ||
        (lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar12 <= lVar15)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2 = phi->fElem;
    if ((iVar11 < 0) || (lVar12 <= lVar14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar9 < 0) || (lVar12 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if (((lVar12 < 3) || (iVar10 < 0)) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((iVar11 < 0) ||
        (lVar5 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar5 <= lVar14)) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) break;
    pdVar4 = phi->fElem;
    if ((iVar9 < 0) || (lVar5 <= lVar13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((iVar10 < 0) || (lVar5 <= lVar15)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar5 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar5 < 3) ||
       (lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
       iVar11 < 0 || lVar6 <= lVar14)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 < 3) || (lVar6 <= lVar16)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dphi->fElem[lVar5 * lVar16 + 2] =
         pdVar4[lVar13] * pdVar4[lVar15] * dphi->fElem[lVar14 * lVar5 + 2] +
         pdVar8[lVar3 * lVar13 + 2] * pdVar2[lVar15] * pdVar2[lVar14] +
         pdVar2[lVar13] * dphi->fElem[lVar12 * lVar15 + 2] * pdVar4[lVar14];
    lVar16 = lVar16 + 1;
    if (lVar16 == 0x12) {
      lVar16 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar16 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2 = phi->fElem;
      if (lVar16 < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar16 < 5) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar16 < 0x13) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2[0x12] = *pdVar2 * pdVar2[2] * pdVar2[4];
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar16 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar16 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar2 = phi->fElem;
      if (lVar16 < 5) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar16 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar16 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar13 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar13 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4 = phi->fElem;
      if (lVar13 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar13 < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar13 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar12 < 5 || lVar13 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar7 = dphi->fElem;
      if ((lVar13 < 1) || (lVar12 < 0x13)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar7[lVar13 * 0x12] =
           *pdVar4 * pdVar4[2] * pdVar7[lVar13 * 4] +
           *dphi->fElem * pdVar2[2] * pdVar2[4] + *pdVar2 * dphi->fElem[lVar16 * 2] * pdVar4[4];
      if ((lVar13 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar16 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((2 < lVar16) && (0 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
        pdVar2 = phi->fElem;
        if (lVar16 < 5) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar16 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar16 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar13 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar13 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar4 = phi->fElem;
        if (lVar13 < 1) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar13 < 3) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar13 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
        if (lVar12 < 5 || lVar13 < 2) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar8 = dphi->fElem;
        if ((lVar13 < 2) || (lVar12 < 0x13)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar8[lVar13 * 0x12 + 1] =
             *pdVar4 * pdVar4[2] * pdVar8[lVar13 * 4 + 1] +
             pdVar7[1] * pdVar2[2] * pdVar2[4] + *pdVar2 * dphi->fElem[lVar16 * 2 + 1] * pdVar4[4];
        if ((lVar13 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar16 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((2 < lVar16) && (0 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
          pdVar2 = phi->fElem;
          if (lVar16 < 5) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar16 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar16 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar13 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar13 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar4 = phi->fElem;
          if (lVar13 < 1) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar13 < 3) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar13 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
          if (lVar12 < 5 || lVar13 < 3) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((lVar13 < 3) || (lVar12 < 0x13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dphi->fElem[lVar13 * 0x12 + 2] =
               *pdVar4 * pdVar4[2] * dphi->fElem[lVar13 * 4 + 2] +
               pdVar8[2] * pdVar2[2] * pdVar2[4] + *pdVar2 * dphi->fElem[lVar16 * 2 + 2] * pdVar4[4]
          ;
          lVar16 = 5;
          while( true ) {
            lVar13 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar13 < 0xe) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar2 = phi->fElem;
            if (lVar13 <= lVar16) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar2[lVar16] = pdVar2[0xd] + pdVar2[lVar16];
            lVar13 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
            if (lVar12 < 0xe || lVar13 < 1) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar2 = dphi->fElem;
            if ((lVar13 < 1) || (lVar12 <= lVar16)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar2[lVar13 * lVar16] = pdVar2[lVar13 * 0xd] + pdVar2[lVar13 * lVar16];
            lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
            if (lVar12 < 0xe || lVar13 < 2) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((lVar13 < 2) || (lVar12 <= lVar16)) break;
            pdVar2[lVar13 * lVar16 + 1] = pdVar2[lVar13 * 0xd + 1] + pdVar2[lVar13 * lVar16 + 1];
            lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
            if (lVar12 < 0xe || lVar13 < 3) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((lVar13 < 3) || (lVar12 <= lVar16)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar2[lVar13 * lVar16 + 2] = pdVar2[lVar13 * 0xd + 2] + pdVar2[lVar13 * lVar16 + 2];
            lVar16 = lVar16 + 1;
            if (lVar16 == 9) {
              lVar16 = 5;
              while( true ) {
                dVar1 = *(double *)(&DAT_01526ec0 + lVar16 * 8);
                if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
                   ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                phi->fElem[lVar16] = phi->fElem[lVar16] * dVar1;
                if ((lVar13 < 1) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pdVar2 = dphi->fElem;
                lVar12 = lVar13 * lVar16;
                pdVar2[lVar12] = pdVar2[lVar12] * dVar1;
                if ((lVar13 < 2) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pdVar2[lVar12 + 1] = pdVar2[lVar12 + 1] * dVar1;
                if ((lVar13 < 3) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) break;
                pdVar2[lVar12 + 2] = dVar1 * pdVar2[lVar12 + 2];
                lVar16 = lVar16 + 1;
                if (lVar16 == 0x13) {
                  return;
                }
              }
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
          }
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapePiram::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		// contribute the ribs
		for(is=NCornerNodes; is<NCornerNodes+8; is++)
		{
			int is1,is2;
			is1 = ContainedSideLocId(is,0);
			is2 = ContainedSideLocId(is,1);
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
		}
		// contribution of the faces
		// quadrilateral face
		is = 13;
		{
			int is1,is2;
			is1 = ShapeFaceId[0][0];// SideConnectLocId(is,0);
			is2 = ShapeFaceId[0][2];// SideConnectLocId(is,2);
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
		}
		is++;
		// triangular faces
		for(;is<18; is++)
		{
			int is1,is2,is3;
			is1 = ContainedSideLocId(is,0);
			is2 = ContainedSideLocId(is,1);
			is3 = ContainedSideLocId(is,2);
			phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
			
		}
		{
			int is1 = 0;
			int is2 = 2;
			int is3 = 4;
			phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
		}
		
		// Make the generating shape functions linear and unitary
		// contribute the ribs
		for(is=NCornerNodes; is<NCornerNodes+4; is++)
		{
			int isface = 13;
			phi(is,0) += phi(isface,0);
			dphi(0,is) += dphi(0,isface);
			dphi(1,is) += dphi(1,isface);
			dphi(2,is) += dphi(2,isface);
		}
		// scaling the shapefunctions
		{
			REAL sidescale[] = {1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,16.,27.,27.,27.,27.,64.};
			for(is=5; is<NSides; is++)
			{
				phi(is,0) *= sidescale[is];
				dphi(0,is) *= sidescale[is];
				dphi(1,is) *= sidescale[is];
				dphi(2,is) *= sidescale[is];
			}
		}
		
		
	}